

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classification.hpp
# Opt level: O2

void __thiscall
boost::algorithm::detail::is_any_ofF<char>::is_any_ofF<boost::iterator_range<char_const*>>
          (is_any_ofF<char> *this,iterator_range<const_char_*> *Range)

{
  is_any_ofF<char> *__dest;
  char *pcVar1;
  char *__src;
  size_t sVar2;
  
  (this->m_Storage).m_dynSet = (set_value_type *)0x0;
  __src = (Range->
          super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>).
          super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
          super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.
          m_Begin;
  pcVar1 = (Range->
           super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>).
           super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
           super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.
           m_End;
  sVar2 = (long)pcVar1 - (long)__src;
  this->m_Size = sVar2;
  __dest = this;
  if (0x10 < sVar2) {
    __dest = (is_any_ofF<char> *)operator_new__(sVar2);
    (this->m_Storage).m_dynSet = (set_value_type *)__dest;
    __src = (Range->
            super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>).
            super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
            super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.
            m_Begin;
    pcVar1 = (Range->
             super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>)
             .super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>
             .super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>
             .m_End;
  }
  if ((long)pcVar1 - (long)__src != 0) {
    memmove(__dest,__src,(long)pcVar1 - (long)__src);
    sVar2 = this->m_Size;
  }
  std::__sort<char*,__gnu_cxx::__ops::_Iter_less_iter>(__dest,(long)&__dest->m_Storage + sVar2);
  return;
}

Assistant:

is_any_ofF( const RangeT& Range ) : m_Size(0)
                {
                    // Prepare storage
                    m_Storage.m_dynSet=0;

                    std::size_t Size=::boost::distance(Range);
                    m_Size=Size;
                    set_value_type* Storage=0;

                    if(use_fixed_storage(m_Size))
                    {
                        // Use fixed storage
                        Storage=&m_Storage.m_fixSet[0];
                    }
                    else
                    {
                        // Use dynamic storage
                        m_Storage.m_dynSet=new set_value_type[m_Size];
                        Storage=m_Storage.m_dynSet;
                    }

                    // Use fixed storage
                    ::std::copy(::boost::begin(Range), ::boost::end(Range), Storage);
                    ::std::sort(Storage, Storage+m_Size);
                }